

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validatePooling3dPadding
                   (Result *__return_storage_ptr__,
                   Pooling3DLayerParams_Pooling3DPaddingType paddingType,int padding,
                   string *paddingName)

{
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string err;
  string *paddingName_local;
  int padding_local;
  Pooling3DLayerParams_Pooling3DPaddingType paddingType_local;
  Result *r;
  
  err.field_2._8_8_ = paddingName;
  if (paddingType == Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    if (padding < 0) {
      std::operator+(&local_a0,"Custom Padding ",paddingName);
      std::operator+(&local_80,&local_a0," must be non-negative, got ");
      std::__cxx11::to_string((string *)((long)&err_1.field_2 + 8),padding);
      std::operator+(&local_60,&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_1.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     &local_60,".");
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
  }
  else if (padding != 0) {
    std::operator+(&local_190,"Custom Padding ",paddingName);
    std::operator+(&local_170,&local_190," cannot be non-zero (got ");
    std::__cxx11::to_string(&local_1b0,padding);
    std::operator+(&local_150,&local_170,&local_1b0);
    std::operator+(&local_130,&local_150,") unless padding type is CUSTOM (got ");
    std::__cxx11::to_string(&local_1d0,paddingType);
    std::operator+(&local_110,&local_130,&local_1d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   &local_110,").");
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    return __return_storage_ptr__;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validatePooling3dPadding(const Specification::Pooling3DLayerParams_Pooling3DPaddingType paddingType,
                              const int padding, const std::string& paddingName) {
    if (paddingType == Specification::Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
        if (padding < 0) {
            std::string err = "Custom Padding " + paddingName + " must be non-negative, got " + std::to_string(padding) + ".";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else {
        if (padding != 0) {
            std::string err = "Custom Padding " + paddingName + " cannot be non-zero (got " + std::to_string(padding)
            + ") unless padding type is CUSTOM (got " + std::to_string(paddingType) + ").";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    Result r;
    return r;
}